

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O0

Super2_Lib_t * Super2_LibFirst(Super2_Man_t *pMan,int nInputs)

{
  Super2_Lib_t *pSVar1;
  Super2_Gate_t **ppSVar2;
  Super2_Gate_t *pSVar3;
  uint local_28;
  int local_24;
  int m;
  int v;
  Super2_Lib_t *pLib;
  int nInputs_local;
  Super2_Man_t *pMan_local;
  
  pSVar1 = Super2_LibStart();
  pSVar1->nInputs = nInputs;
  pSVar1->nMints = 1 << ((byte)nInputs & 0x1f);
  pSVar1->nLevels = 0;
  pSVar1->nGates = nInputs + 1;
  pSVar1->nGatesAlloc = nInputs + 1;
  pSVar1->uMaskBit = 1 << ((char)pSVar1->nMints - 1U & 0x1f);
  ppSVar2 = (Super2_Gate_t **)malloc((long)(nInputs + 1) << 3);
  pSVar1->pGates = ppSVar2;
  pSVar3 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(pMan->pMem);
  *pSVar1->pGates = pSVar3;
  memset(*pSVar1->pGates,0,0x20);
  for (local_24 = 0; local_24 < nInputs; local_24 = local_24 + 1) {
    pSVar3 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(pMan->pMem);
    pSVar1->pGates[local_24 + 1] = pSVar3;
    memset(pSVar1->pGates[local_24 + 1],0,0x20);
    pSVar1->pGates[local_24 + 1]->pTwo = (Super2_Gate_t *)(long)local_24;
  }
  for (local_28 = 0; (int)local_28 < pSVar1->nMints; local_28 = local_28 + 1) {
    for (local_24 = 0; local_24 < nInputs; local_24 = local_24 + 1) {
      if ((local_28 & 1 << ((byte)local_24 & 0x1f)) != 0) {
        pSVar1->pGates[local_24 + 1]->uTruth =
             1 << ((byte)local_28 & 0x1f) | pSVar1->pGates[local_24 + 1]->uTruth;
      }
    }
  }
  return pSVar1;
}

Assistant:

Super2_Lib_t * Super2_LibFirst( Super2_Man_t * pMan, int nInputs )
{
    Super2_Lib_t * pLib;
    int v, m;    

    // start the library
    pLib = Super2_LibStart();

    // create the starting supergates
    pLib->nInputs     = nInputs;
    pLib->nMints      = (1 << nInputs);
    pLib->nLevels     = 0;
    pLib->nGates      = nInputs + 1;
    pLib->nGatesAlloc = nInputs + 1;
    pLib->uMaskBit    = (1 << (pLib->nMints-1));
    pLib->pGates      = ABC_ALLOC( Super2_Gate_t *, nInputs + 1 );
    // add the constant 0
    pLib->pGates[0] = (Super2_Gate_t *)Extra_MmFixedEntryFetch( pMan->pMem );
    memset( pLib->pGates[0], 0, sizeof(Super2_Gate_t) );
    // add the elementary gates
    for ( v = 0; v < nInputs; v++ )
    {
        pLib->pGates[v+1] = (Super2_Gate_t *)Extra_MmFixedEntryFetch( pMan->pMem );
        memset( pLib->pGates[v+1], 0, sizeof(Super2_Gate_t) );
        pLib->pGates[v+1]->pTwo = (Super2_Gate_t *)(ABC_PTRUINT_T)v;
    }

    // set up their truth tables
    for ( m = 0; m < pLib->nMints; m++ )
        for ( v = 0; v < nInputs; v++ )
            if ( m & (1 << v) )
                pLib->pGates[v+1]->uTruth |= (1 << m);
    return pLib;
}